

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitTryCatchAroundIteratorClose
               (RegSlot iteratorLocation,ByteCodeLabel endLabel,ByteCodeGenerator *byteCodeGenerator
               ,FuncInfo *funcInfo,bool isAsync)

{
  ByteCodeWriter *this;
  ByteCodeLabel labelID;
  RegSlot R0;
  undefined7 in_register_00000081;
  
  this = &byteCodeGenerator->m_writer;
  labelID = Js::ByteCodeWriter::DefineLabel(this);
  Js::ByteCodeWriter::Br(this,TryCatch,labelID);
  if ((int)CONCAT71(in_register_00000081,isAsync) == 0) {
    EmitIteratorClose(iteratorLocation,byteCodeGenerator,funcInfo,false);
  }
  else {
    ByteCodeGenerator::PushJumpCleanupForTry
              (byteCodeGenerator,TryCatch,labelID,0xffffffff,0xffffffff);
    EmitIteratorClose(iteratorLocation,byteCodeGenerator,funcInfo,true);
    DListBase<JumpCleanupInfo,_RealCount>::RemoveHead<Memory::ArenaAllocator>
              (&byteCodeGenerator->jumpCleanupList->super_DListBase<JumpCleanupInfo,_RealCount>,
               byteCodeGenerator->jumpCleanupList->allocator);
  }
  Js::ByteCodeWriter::Empty(this,Leave);
  Js::ByteCodeWriter::Br(this,endLabel);
  Js::ByteCodeWriter::MarkLabel(this,labelID);
  R0 = FuncInfo::AcquireTmpRegister(funcInfo);
  Js::ByteCodeWriter::Reg1(this,Catch,R0);
  FuncInfo::ReleaseTmpRegister(funcInfo,R0);
  Js::ByteCodeWriter::Empty(this,Leave);
  return;
}

Assistant:

void EmitTryCatchAroundIteratorClose(
    Js::RegSlot iteratorLocation,
    Js::ByteCodeLabel endLabel,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    bool isAsync)
{
    Js::ByteCodeLabel catchLabel = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->Br(Js::OpCode::TryCatch, catchLabel);

    // Jump cleanup is only needed in a for-await loop since it will await the
    // result of the call to the return method. Otherwise there can be no jump.
    if (isAsync)
        byteCodeGenerator->PushJumpCleanupForTry(Js::OpCode::TryCatch, catchLabel);

    EmitIteratorClose(iteratorLocation, byteCodeGenerator, funcInfo, isAsync);

    if (isAsync)
        byteCodeGenerator->PopJumpCleanup();

    byteCodeGenerator->Writer()->Empty(Js::OpCode::Leave);
    byteCodeGenerator->Writer()->Br(endLabel);

    byteCodeGenerator->Writer()->MarkLabel(catchLabel);
    Js::RegSlot catchParamLocation = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::Catch, catchParamLocation);
    funcInfo->ReleaseTmpRegister(catchParamLocation);

    byteCodeGenerator->Writer()->Empty(Js::OpCode::Leave);
}